

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O0

void __thiscall
hwtest::pgraph::MthdKelvinPolygonOffsetPointEnable::~MthdKelvinPolygonOffsetPointEnable
          (MthdKelvinPolygonOffsetPointEnable *this)

{
  MthdKelvinPolygonOffsetPointEnable *this_local;
  
  ~MthdKelvinPolygonOffsetPointEnable(this);
  operator_delete(this);
  return;
}

Assistant:

void adjust_orig_mthd() override {
		if (rnd() & 1) {
			val &= 0xffff;
			if (rnd() & 1) {
				val &= 0xf;
			}
			if (rnd() & 1) {
				val |= 1 << (rnd() & 0x1f);
				if (rnd() & 1) {
					val |= 1 << (rnd() & 0x1f);
				}
			}
		}
		adjust_orig_bundle(&orig);
	}